

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tfidfinit.cpp
# Opt level: O2

void createwords(void)

{
  ulong uVar1;
  int j_1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int offset;
  ulong uVar5;
  int iVar6;
  _Rb_tree<point,_std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *this;
  int j;
  long lVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int i;
  long lVar12;
  map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  (*pamVar13) [100];
  long lVar14;
  double dVar15;
  vector<int,_std::allocator<int>_> qu_1;
  long local_138;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  select;
  vector<int,_std::allocator<int>_> qu;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_d0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_a0;
  ulong local_68;
  int bucket;
  _Rb_tree_node_base local_58;
  size_t local_38;
  
  iVar10 = ts_len / 0x14 + 9;
  iVar10 = iVar10 - iVar10 % 10;
  iVar11 = iVar10;
  if (iVar10 < 0xb) {
    iVar10 = 10;
    iVar11 = iVar10;
  }
  while (pamVar13 = tree, iVar10 <= ts_len) {
    for (lVar12 = 0; lVar12 != 5; lVar12 = lVar12 + 1) {
      this = (_Rb_tree<point,_std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              *)pamVar13;
      for (lVar7 = 0; lVar7 <= num_c; lVar7 = lVar7 + 1) {
        std::
        _Rb_tree<point,_std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
        ::clear(this);
        this = this + 1;
      }
      pamVar13 = (map<point,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<point>,_std::allocator<std::pair<const_point,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  (*) [100])((long)pamVar13 + 0x12c0);
    }
    for (lVar12 = 0; lVar12 != 5; lVar12 = lVar12 + 1) {
      uVar2 = iVar10 / PAA_DIMENSION[lVar12];
      if (iVar10 % PAA_DIMENSION[lVar12] == 0) {
        uVar5 = 0;
        if (0 < (int)uVar2) {
          uVar5 = (ulong)uVar2;
        }
        lVar7 = 0;
        while( true ) {
          uVar3 = (ulong)data_n;
          if ((long)uVar3 <= lVar7) break;
          for (uVar3 = 0; uVar3 != uVar5; uVar3 = uVar3 + 1) {
            qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            uVar4 = uVar3;
            while (uVar1 = uVar4 + (long)(int)uVar2, (long)uVar1 <= (long)ts_len) {
              dVar15 = 0.0;
              for (; (long)uVar4 < (long)uVar1; uVar4 = uVar4 + 1) {
                dVar15 = dVar15 + data_x.
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar4];
              }
              dVar15 = floor((dVar15 / (double)(int)uVar2 - min_data) / bucket_w + -1e-08);
              bucket = (int)dVar15;
              std::vector<int,_std::allocator<int>_>::push_back(&qu,&bucket);
              uVar4 = uVar1;
            }
            for (lVar8 = 0;
                (ulong)(PAA_DIMENSION[lVar12] + lVar8) <=
                (ulong)((long)qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); lVar8 = lVar8 + 1) {
              insertintohashmap(&qu,(int)lVar8,(int)lVar12,(int)lVar7,iVar10,(int)uVar3);
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&qu.super__Vector_base<int,_std::allocator<int>_>);
          }
          lVar7 = lVar7 + 1;
        }
        for (lVar7 = 0; lVar7 < (int)uVar3; lVar7 = lVar7 + 1) {
          uVar3 = 0;
          while (uVar3 != uVar5) {
            qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            local_68 = uVar3;
            while (uVar4 = uVar3 + (long)(int)uVar2, (long)uVar4 <= (long)ts_len) {
              dVar15 = 0.0;
              for (; (long)uVar3 < (long)uVar4; uVar3 = uVar3 + 1) {
                dVar15 = dVar15 + data_x.
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar7].
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar3];
              }
              dVar15 = floor((dVar15 / (double)(int)uVar2 - min_data) / bucket_w);
              qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start = (pointer)CONCAT44(qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start._4_4_,(int)dVar15);
              std::vector<int,_std::allocator<int>_>::push_back(&qu_1,(value_type_conflict1 *)&qu);
              uVar3 = uVar4;
            }
            local_138 = 0;
            for (offset = 0;
                (ulong)((long)offset + (long)PAA_DIMENSION[lVar12]) <=
                (ulong)((long)qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2); offset = offset + 1) {
              select.
              super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_58._M_color = _S_red;
              local_58._M_parent = (_Base_ptr)0x0;
              local_58._M_left = &local_58;
              local_38 = 0;
              select.
              super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              select.
              super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              lVar8 = 0x28;
              iVar6 = 0;
              local_58._M_right = local_58._M_left;
              for (lVar14 = 0; uVar3 = (ulong)num_c, lVar14 < (long)uVar3; lVar14 = lVar14 + 1) {
                queryfromhashmap((set<int,_std::less<int>,_std::allocator<int>_> *)&qu,&qu_1,offset,
                                 (int)lVar12,(int)lVar14);
                std::
                vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                ::emplace_back<std::set<int,std::less<int>,std::allocator<int>>>
                          ((vector<std::set<int,std::less<int>,std::allocator<int>>,std::allocator<std::set<int,std::less<int>,std::allocator<int>>>>
                            *)&select,(set<int,_std::less<int>,_std::allocator<int>_> *)&qu);
                std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                           *)&qu);
                if (*(long *)(&((select.
                                 super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0
                             + lVar8) != 0) {
                  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                  _M_insert_range_unique<std::_Rb_tree_const_iterator<int>>
                            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>
                              *)&bucket,
                             *(_Base_ptr *)
                              ((long)select.
                                     super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar8 + -0x10),
                             (_Base_ptr)
                             ((long)select.
                                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar8 + -0x20));
                  iVar6 = iVar6 + 1;
                }
                lVar8 = lVar8 + 0x30;
              }
              if (iVar6 == 1) {
                for (lVar8 = 0; lVar8 < (int)uVar3; lVar8 = lVar8 + 1) {
                  iVar6 = (int)select.
                               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t._M_impl.
                               super__Rb_tree_header._M_node_count;
                  if (iVar6 != 0) {
                    qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_end_of_storage = (pointer)0x0;
                    local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                    local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                    local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
                         &local_d0._M_impl.super__Rb_tree_header._M_header;
                    local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
                    local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                    local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                    local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
                         &local_a0._M_impl.super__Rb_tree_header._M_header;
                    local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
                    qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_start = (pointer)((double)iVar6 / (double)datacnt[lVar8]);
                    qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_finish = (pointer)CONCAT44(qu.super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                                   uVar2);
                    local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
                         local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
                    local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
                         local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
                    std::
                    _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                    operator=(&local_d0,
                              &select.
                               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar8]._M_t);
                    std::
                    _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
                    operator=(&local_a0,
                              (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                               *)&bucket);
                    lVar14 = local_138;
                    for (lVar9 = 0; lVar9 < PAA_DIMENSION[lVar12]; lVar9 = lVar9 + 1) {
                      std::vector<int,_std::allocator<int>_>::push_back
                                ((vector<int,_std::allocator<int>_> *)
                                 &qu.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage,
                                 (value_type_conflict1 *)
                                 ((long)qu_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar14));
                      lVar14 = lVar14 + 4;
                    }
                    std::vector<paaword,_std::allocator<paaword>_>::push_back
                              (candidates + lVar8,(value_type *)&qu);
                    paaword::~paaword((value_type *)&qu);
                    uVar3 = (ulong)(uint)num_c;
                  }
                }
              }
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                         *)&bucket);
              std::
              vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ::~vector(&select);
              local_138 = local_138 + 4;
            }
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&qu_1.super__Vector_base<int,_std::allocator<int>_>);
            uVar3 = local_68 + 1;
          }
          uVar3 = (ulong)(uint)data_n;
        }
      }
    }
    iVar10 = iVar10 + iVar11;
  }
  return;
}

Assistant:

void createwords() {
    int shapelet_minlen = max(DEFAULT_PAA_DIMENSION, (ts_len / 20 + DEFAULT_PAA_DIMENSION - 1)
                                                     / DEFAULT_PAA_DIMENSION * DEFAULT_PAA_DIMENSION);
    for (int len = shapelet_minlen; len <= ts_len; len += shapelet_minlen) {
//        printf("search length %d:\n", len);

        // clear hash map
        for (int i = 0; i < D_NUM; ++i) {
            for (int j = 0; j <= num_c; ++j) {
                tree[i][j].clear();
            }
        }

        for (int d = 0; d < D_NUM; ++d) {
            if (len % PAA_DIMENSION[d] != 0) {
                continue;
            }

            // PAA window
            int window = len / PAA_DIMENSION[d];

            // insert words into hashmap
            for (int i = 0; i < data_n; ++i) {
                for (int start = 0; start < window; ++start) {
                    vector<int> qu;

                    // PAA
                    for (int offset = start; offset + window <= ts_len; offset += window) {
                        double avg = 0;
                        for (int j = offset; j < offset + window; ++j) {
                            avg += data_x[i][j];
                        }
                        int bucket = (int) floor((avg / window - min_data) / bucket_w - 1e-8);
                        qu.push_back(bucket);
                    }

                    // insert into hash map
                    for (int j = 0; j + PAA_DIMENSION[d] <= qu.size(); ++j) {
//                        insertintohashmap(qu, j, d, i);
                        insertintohashmap(qu, j, d, i, len, start);
                    }

                }
            }
//            printf("dimension %d insert finished\n", PAA_DIMENSION[d]);

            // query from hashmap to calculate tfidf score
            for (int i = 0; i < data_n; ++i) {
                for (int start = 0; start < window; ++start) {
                    vector<int> qu;

                    // PAA
                    for (int offset = start; offset + window <= ts_len; offset += window) {
                        double avg = 0;
                        for (int j = offset; j < offset + window; ++j) {
                            avg += data_x[i][j];
                        }
                        int bucket = (int) floor((avg / window - min_data) / bucket_w);
                        qu.push_back(bucket);
                    }

                    // query from hash map
                    for (int j = 0; j + PAA_DIMENSION[d] <= qu.size(); ++j) {

                        int inclasses = 0;

                        vector<set<int> > select;
                        set<int> allselect;
                        for (int k = 0; k < num_c; ++k) {
                            select.push_back(queryfromhashmap(qu, j, d, k));
                            if (select[k].size() != 0) {
                                ++inclasses;
                                allselect.insert(select[k].begin(), select[k].end());
                            }
                        }

                        if (inclasses != 1) {
                            continue;
                        }
                        double idf = log2(2.0);

//                        double idf = log2((double) (num_c) / inclasses);

                        for (int k = 0; k < num_c; ++k) {

                            int inthisclass = (int) select[k].size();

                            if (inthisclass == 0) {
                                continue;
                            }

                            double tf = (double) (inthisclass) / datacnt[k];

                            paaword now;
                            now.window = window;
                            now.score = tf * idf;
                            now.cov = select[k];
                            now.allcov = allselect;
                            for (int cp = 0; cp < PAA_DIMENSION[d]; ++cp) {
                                now.vec.push_back(qu[j + cp]);
                            }
                            candidates[k].push_back(now);

                        }
                    }
                }
            }
//            printf("dimension %d query finished\n", PAA_DIMENSION[d]);
        }
    }
}